

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

void __thiscall IR::Instr::TransferTo(Instr *this,Instr *instr)

{
  Opnd *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RegOpnd *pRVar4;
  StackSym *pSVar5;
  StackSym *pSVar6;
  StackSym *stackSym;
  Sym *sym;
  Opnd *dst;
  Instr *instr_local;
  Instr *this_local;
  
  if (instr->m_dst != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xc64,"(instr->m_dst == nullptr)","instr->m_dst == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (instr->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xc65,"(instr->m_src1 == nullptr)","instr->m_src1 == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (instr->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xc66,"(instr->m_src2 == nullptr)","instr->m_src2 == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  TransferDstAttributesTo(this,instr);
  *(ushort *)&instr->field_0x36 =
       *(ushort *)&instr->field_0x36 & 0xffef | (*(ushort *)&this->field_0x36 >> 4 & 1) << 4;
  instr->field_0x38 = instr->field_0x38 & 0xf7 | ((byte)this->field_0x38 >> 3 & 1) << 3;
  *(ushort *)&instr->field_0x36 =
       *(ushort *)&instr->field_0x36 & 0xffbf | (*(ushort *)&this->field_0x36 >> 6 & 1) << 6;
  *(ushort *)&instr->field_0x36 =
       *(ushort *)&instr->field_0x36 & 0xff7f | (*(ushort *)&this->field_0x36 >> 7 & 1) << 7;
  *(ushort *)&instr->field_0x36 =
       *(ushort *)&instr->field_0x36 & 0xfeff | (*(ushort *)&this->field_0x36 >> 8 & 1) << 8;
  instr->ignoreOverflowBitCount = this->ignoreOverflowBitCount;
  *(ushort *)&instr->field_0x36 =
       *(ushort *)&instr->field_0x36 & 0xfbff | (*(ushort *)&this->field_0x36 >> 10 & 1) << 10;
  *(ushort *)&instr->field_0x36 =
       *(ushort *)&instr->field_0x36 & 0xf7ff | (*(ushort *)&this->field_0x36 >> 0xb & 1) << 0xb;
  *(ushort *)&instr->field_0x36 =
       *(ushort *)&instr->field_0x36 & 0xefff | (*(ushort *)&this->field_0x36 >> 0xc & 1) << 0xc;
  instr->m_number = this->m_number;
  instr->m_src1 = this->m_src1;
  instr->m_src2 = this->m_src2;
  *(ushort *)&instr->field_0x36 =
       *(ushort *)&instr->field_0x36 & 0xbfff | (*(ushort *)&this->field_0x36 >> 0xe & 1) << 0xe;
  *(ushort *)&instr->field_0x36 =
       *(ushort *)&instr->field_0x36 & 0x7fff | *(ushort *)&this->field_0x36 & 0x8000;
  instr->dataWidth = this->dataWidth;
  *(ushort *)&instr->field_0x36 =
       *(ushort *)&instr->field_0x36 & 0xdfff | (*(ushort *)&this->field_0x36 >> 0xd & 1) << 0xd;
  *(ushort *)&instr->field_0x36 =
       *(ushort *)&instr->field_0x36 & 0xfdff | (*(ushort *)&this->field_0x36 >> 9 & 1) << 9;
  this_00 = this->m_dst;
  if (this_00 != (Opnd *)0x0) {
    instr->m_dst = this_00;
    this->m_dst = (Opnd *)0x0;
    bVar2 = Opnd::IsRegOpnd(this_00);
    if (bVar2) {
      pRVar4 = Opnd::AsRegOpnd(this_00);
      pSVar6 = pRVar4->m_sym;
      bVar2 = Sym::IsStackSym(&pSVar6->super_Sym);
      if ((bVar2) &&
         (pSVar5 = Sym::AsStackSym(&pSVar6->super_Sym), (*(uint *)&pSVar5->field_0x18 & 1) != 0)) {
        pSVar5 = Sym::AsStackSym(&pSVar6->super_Sym);
        if ((pSVar5->field_5).m_instrDef != this) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                             ,0xc84,"(sym->AsStackSym()->m_instrDef == this)",
                             "sym->AsStackSym()->m_instrDef == this");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 0;
        }
        pSVar6 = Sym::AsStackSym(&pSVar6->super_Sym);
        (pSVar6->field_5).m_instrDef = instr;
      }
    }
  }
  this->m_src1 = (Opnd *)0x0;
  this->m_src2 = (Opnd *)0x0;
  return;
}

Assistant:

void
Instr::TransferTo(Instr * instr)
{
    Assert(instr->m_dst == nullptr);
    Assert(instr->m_src1 == nullptr);
    Assert(instr->m_src2 == nullptr);
    this->TransferDstAttributesTo(instr);
    instr->usesStackArgumentsObject = this->usesStackArgumentsObject;
    instr->isCloned = this->isCloned;
    instr->ignoreNegativeZero = this->ignoreNegativeZero;
    instr->ignoreIntOverflow = this->ignoreIntOverflow;
    instr->ignoreIntOverflowInRange = this->ignoreIntOverflowInRange;
    instr->ignoreOverflowBitCount = this->ignoreOverflowBitCount;
    instr->loadedArrayHeadSegment = this->loadedArrayHeadSegment;
    instr->loadedArrayHeadSegmentLength = this->loadedArrayHeadSegmentLength;
    instr->extractedUpperBoundCheckWithoutHoisting = this->extractedUpperBoundCheckWithoutHoisting;
    instr->m_number = this->m_number;
    instr->m_src1 = this->m_src1;
    instr->m_src2 = this->m_src2;
    instr->dstIsAlwaysConvertedToInt32 = this->dstIsAlwaysConvertedToInt32;
    instr->dstIsAlwaysConvertedToNumber = this->dstIsAlwaysConvertedToNumber;
    instr->dataWidth = this->dataWidth;
    instr->isCtorCall = this->isCtorCall;
    instr->forcePreOpBailOutIfNeeded = this->forcePreOpBailOutIfNeeded;
    IR::Opnd * dst = this->m_dst;

    if (dst)
    {
        instr->m_dst = dst;
        this->m_dst = nullptr;
        if (dst->IsRegOpnd())
        {
            Sym * sym = dst->AsRegOpnd()->m_sym;
            if (sym->IsStackSym() && sym->AsStackSym()->m_isSingleDef)
            {
                Assert(sym->AsStackSym()->m_instrDef == this);
                StackSym * stackSym = sym->AsStackSym();
                stackSym->m_instrDef = instr;
            }
        }
    }

    this->m_src1 = nullptr;
    this->m_src2 = nullptr;
}